

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dont_underflow_cpp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  string str;
  allocator<char> local_29;
  long *local_28;
  long local_20;
  long local_18 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,argv[1],&local_29);
  if (local_20 != 0) {
    lVar3 = local_20 + 1;
    do {
      if (lVar3 == 1) goto LAB_001011e8;
      lVar1 = lVar3 + -1;
      lVar2 = lVar3 + -2;
      lVar3 = lVar1;
    } while (*(char *)((long)local_28 + lVar2) != ':');
    *(undefined1 *)((long)local_28 + lVar1) = 0;
    local_20 = lVar1;
  }
LAB_001011e8:
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  std::string str = argv[1];
  size_t pos = str.find_last_of(':');
  if (pos != std::string::npos)
    str.erase(pos + 1);
}